

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_conserve.cpp
# Opt level: O0

void Omega_h::transfer_by_intersection
               (Mesh *old_mesh,Mesh *new_mesh,TagBase *tagbase,Cavs *cavs,
               Write<double> *new_elem_densities_w)

{
  Cavs *tagbase_00;
  TagBase *new_mesh_00;
  Mesh *old_mesh_00;
  Write<double> local_138;
  Cavs local_128;
  Write<double> local_e8;
  Cavs local_d8;
  Write<double> local_88;
  Cavs local_78;
  uint local_34;
  Write<double> *pWStack_30;
  Int dim;
  Write<double> *new_elem_densities_w_local;
  Cavs *cavs_local;
  TagBase *tagbase_local;
  Mesh *new_mesh_local;
  Mesh *old_mesh_local;
  
  pWStack_30 = new_elem_densities_w;
  new_elem_densities_w_local = (Write<double> *)cavs;
  cavs_local = (Cavs *)tagbase;
  tagbase_local = (TagBase *)new_mesh;
  new_mesh_local = old_mesh;
  local_34 = Mesh::dim(old_mesh);
  old_mesh_00 = new_mesh_local;
  new_mesh_00 = tagbase_local;
  tagbase_00 = cavs_local;
  if (local_34 == 3) {
    Cavs::Cavs(&local_78,cavs);
    Write<double>::Write(&local_88,new_elem_densities_w);
    transfer_by_intersection_dim<3>
              (old_mesh_00,(Mesh *)new_mesh_00,(TagBase *)tagbase_00,&local_78,&local_88);
    Write<double>::~Write(&local_88);
    Cavs::~Cavs(&local_78);
  }
  else if (local_34 == 2) {
    Cavs::Cavs(&local_d8,cavs);
    Write<double>::Write(&local_e8,new_elem_densities_w);
    transfer_by_intersection_dim<2>
              (old_mesh_00,(Mesh *)new_mesh_00,(TagBase *)tagbase_00,&local_d8,&local_e8);
    Write<double>::~Write(&local_e8);
    Cavs::~Cavs(&local_d8);
  }
  else {
    if (local_34 != 1) {
      fail("unsupported dim %d\n",(ulong)local_34);
    }
    Cavs::Cavs(&local_128,cavs);
    Write<double>::Write(&local_138,new_elem_densities_w);
    transfer_by_intersection_dim<1>
              (old_mesh_00,(Mesh *)new_mesh_00,(TagBase *)tagbase_00,&local_128,&local_138);
    Write<double>::~Write(&local_138);
    Cavs::~Cavs(&local_128);
  }
  return;
}

Assistant:

static void transfer_by_intersection(Mesh* old_mesh, Mesh* new_mesh,
    TagBase const* tagbase, Cavs cavs, Write<Real> new_elem_densities_w) {
  auto dim = old_mesh->dim();
  if (dim == 3) {
    transfer_by_intersection_dim<3>(
        old_mesh, new_mesh, tagbase, cavs, new_elem_densities_w);
  } else if (dim == 2) {
    transfer_by_intersection_dim<2>(
        old_mesh, new_mesh, tagbase, cavs, new_elem_densities_w);
  } else if (dim == 1) {
    transfer_by_intersection_dim<1>(
        old_mesh, new_mesh, tagbase, cavs, new_elem_densities_w);
  } else {
    Omega_h_fail("unsupported dim %d\n", dim);
  }
}